

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configreader.cpp
# Opt level: O2

bool __thiscall ConfigReader::parse(ConfigReader *this,istream *configstream)

{
  char cVar1;
  bool bVar2;
  token_t tVar3;
  ostream *poVar4;
  bool bVar5;
  bool bVar6;
  string tokstr;
  string local_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  this->m_lineNum = 1;
  if (*(int *)(configstream + *(long *)(*(long *)configstream + -0x18) + 0x20) == 0) {
    this->m_is = configstream;
    tokstr._M_dataplus._M_p = (pointer)&tokstr.field_2;
    tokstr._M_string_length = 0;
    tokstr.field_2._M_local_buf[0] = '\0';
    cVar1 = std::istream::get();
    this->m_tokchar = cVar1;
    bVar6 = false;
    do {
      tVar3 = tokenize(this,&tokstr);
      if (bVar6) {
        bVar6 = tVar3 != TOK_EOL;
      }
      else if (tVar3 == TOK_IDENT) {
        bVar6 = std::operator==(&tokstr,"CORNER");
        if (bVar6) {
          bVar2 = parseCorner(this);
        }
        else {
          bVar6 = std::operator==(&tokstr,"AREA");
          if (bVar6) {
            bVar2 = parseArea(this);
          }
          else {
            bVar6 = std::operator==(&tokstr,"PAD");
            if (bVar6) {
              bVar2 = parsePad(this);
            }
            else {
              bVar6 = std::operator==(&tokstr,"GRID");
              if (bVar6) {
                bVar2 = parseGrid(this);
              }
              else {
                bVar6 = std::operator==(&tokstr,"SPACE");
                if (bVar6) {
                  bVar2 = parseSpace(this);
                }
                else {
                  bVar6 = std::operator==(&tokstr,"FILLER");
                  if (bVar6) {
                    bVar2 = parseFiller(this);
                  }
                  else {
                    bVar6 = std::operator==(&tokstr,"OFFSET");
                    if (bVar6) {
                      bVar2 = parseOffset(this);
                    }
                    else {
                      bVar6 = std::operator==(&tokstr,"DESIGN");
                      if (!bVar6) {
                        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
                        poVar4 = std::operator<<(local_1a8,"unrecognized item ");
                        poVar4 = std::operator<<(poVar4,(string *)&tokstr);
                        std::operator<<(poVar4,"\n");
                        std::__cxx11::stringbuf::str();
                        error(this,&local_1d8);
                        std::__cxx11::string::~string((string *)&local_1d8);
                        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
                        goto LAB_00123b06;
                      }
                      bVar2 = parseDesignName(this);
                    }
                  }
                }
              }
            }
          }
        }
        bVar6 = false;
        bVar5 = false;
        if (bVar2 == false) goto LAB_00123c86;
      }
      else if (tVar3 == TOK_HASH) {
        bVar6 = true;
      }
      else {
        if (tVar3 == TOK_ERR) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ss,"Config parse error\n",(allocator<char> *)&local_1d8);
          error(this,(string *)&ss);
          std::__cxx11::string::~string((string *)&ss);
        }
LAB_00123b06:
        bVar6 = false;
      }
    } while (tVar3 != TOK_EOF);
    bVar5 = true;
LAB_00123c86:
    std::__cxx11::string::~string((string *)&tokstr);
  }
  else {
    bVar5 = false;
    doLog(8,"ConfigReader: input stream is not open\n");
  }
  return bVar5;
}

Assistant:

bool ConfigReader::parse(std::istream &configstream)
{
    m_lineNum = 1;

    if (!configstream.good())
    {
        doLog(LOG_ERROR,"ConfigReader: input stream is not open\n");
        return false;
    }

    m_is = &configstream;
    std::string tokstr;
    m_tokchar = m_is->get();

    bool m_inComment = false;
    
    ConfigReader::token_t tok = TOK_EOF;
    do
    {
        tok = tokenize(tokstr);
        if (!m_inComment)
        {   
            switch(tok)
            {
            case TOK_ERR:
                error("Config parse error\n");
                break;
            case TOK_HASH:  // line comment
                m_inComment = true;
                break;
            case TOK_IDENT:
                if (tokstr == "CORNER")
                {
                    if (!parseCorner()) return false;
                }
                else if (tokstr == "AREA")
                {
                    if (!parseArea()) return false;
                }
                else if (tokstr == "PAD")
                {
                    if (!parsePad()) return false;
                }
                else if (tokstr == "GRID")
                {
                    if (!parseGrid()) return false;
                }
                else if (tokstr == "SPACE")
                {
                    if (!parseSpace()) return false;
                }
                else if (tokstr == "FILLER")
                {
                    if (!parseFiller()) return false;
                }                
                else if (tokstr == "OFFSET")
                {
                    if (!parseOffset()) return false;
                }
                else if (tokstr == "DESIGN")
                {
                    if (!parseDesignName()) return false;
                }                
                else
                {
                    std::stringstream ss;
                    ss << "unrecognized item " << tokstr << "\n";
                    error(ss.str());
                }
                break;
            default:
                ;
            }
        }
        else
        {
            if (tok == TOK_EOL)
            {
                m_inComment = false;
            }
        }
    } while(tok != TOK_EOF);

    return true;
}